

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-light.c
# Opt level: O3

_Bool borg_check_light_only(void)

{
  uint8_t uVar1;
  short sVar2;
  short sVar3;
  borg_grid *pbVar4;
  bool bVar5;
  chunk_conflict *pcVar6;
  _Bool _Var7;
  long lVar8;
  long lVar9;
  loc lVar10;
  int iVar11;
  int x;
  long lVar12;
  
  if (((borg.trait[0x69] != 0) && (borg.trait[0x70] == 0)) && (borg.trait[0x78] == 0)) {
    if (((borg.when_wizard_light == 0) || (999 < (int)borg_t - (int)borg.when_wizard_light)) &&
       (((_Var7 = borg_activate_item(act_clairvoyance), _Var7 ||
         ((_Var7 = borg_activate_item(act_enlightenment), _Var7 ||
          (_Var7 = borg_spell_fail(FUME_OF_MORDOR,L'('), _Var7)))) ||
        (_Var7 = borg_spell_fail(CLAIRVOYANCE,L'('), _Var7)))) {
      borg_note("# Wizard lighting the dungeon");
      borg.when_wizard_light = borg_t;
      return true;
    }
    if (borg.trait[0x19] == 4) {
      _Var7 = borg_check_dark_only();
      return _Var7;
    }
    if ((borg.when_call_light == 0) || (6 < (int)borg_t - (int)borg.when_call_light)) {
      if (borg.trait[0x1a] == 1) {
        lVar12 = 0;
        iVar11 = 0;
        do {
          pcVar6 = cave;
          lVar8 = (long)borg.c.x;
          sVar2 = ddx_ddd[lVar12 + 4];
          lVar9 = (long)borg.c.y;
          sVar3 = ddy_ddd[lVar12 + 4];
          lVar10 = (loc)loc((int)(sVar2 + lVar8),(int)(sVar3 + lVar9));
          _Var7 = square_in_bounds_fully(pcVar6,lVar10);
          if (_Var7) {
            uVar1 = borg_grids[sVar3 + lVar9][sVar2 + lVar8].feat;
            _Var7 = borg_cave_floor_grid(borg_grids[sVar3 + lVar9] + sVar2 + lVar8);
            iVar11 = iVar11 + (uint)!_Var7 + (uint)(uVar1 == '\0');
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 != 4);
        if (2 < iVar11) {
          return false;
        }
      }
      else if (1 < borg.trait[0x1a]) {
        iVar11 = 0;
        lVar12 = (long)(borg.c.y + -2);
        do {
          x = borg.c.x + -2;
          lVar8 = (long)x + -1;
          lVar9 = (long)x * 0xc;
          do {
            pcVar6 = cave;
            lVar10 = (loc)loc(x,(int)lVar12);
            _Var7 = square_in_bounds_fully(pcVar6,lVar10);
            if (_Var7) {
              pbVar4 = borg_grids[lVar12];
              _Var7 = borg_cave_floor_grid((borg_grid *)(&pbVar4->feat + lVar9));
              pcVar6 = cave;
              if ((_Var7) && ((*(byte *)((long)&pbVar4->info + lVar9) & 0x10) != 0)) {
                lVar10 = (loc)loc(x,(int)lVar12);
                _Var7 = square_isglow(pcVar6,lVar10);
                iVar11 = iVar11 + (uint)!_Var7;
              }
            }
            lVar8 = lVar8 + 1;
            lVar9 = lVar9 + 0xc;
            x = x + 1;
          } while (lVar8 < (long)borg.c.x + 2);
          bVar5 = lVar12 < (long)borg.c.y + 2;
          lVar12 = lVar12 + 1;
        } while (bVar5);
        if (iVar11 < 0xb) {
          return false;
        }
      }
      _Var7 = borg_activate_item(act_illumination);
      if (((((_Var7) || (_Var7 = borg_activate_item(act_light), _Var7)) ||
           (_Var7 = borg_zap_rod(sv_rod_illumination), _Var7)) ||
          ((_Var7 = borg_use_staff(sv_staff_light), _Var7 ||
           (_Var7 = borg_read_scroll(sv_scroll_light), _Var7)))) ||
         ((_Var7 = borg_spell_fail(LIGHT_ROOM,L'('), _Var7 ||
          (_Var7 = borg_spell_fail(CALL_LIGHT,L'('), _Var7)))) {
        borg_note("# Illuminating the dungeon");
        borg_react("SELF:lite","SELF:lite");
        borg.when_call_light = borg_t;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool borg_check_light_only(void)
{
    /* Never in town, when blind or when hallucinating */
    if (!borg.trait[BI_CDEPTH])
        return false;
    if (borg.trait[BI_ISBLIND] || borg.trait[BI_ISIMAGE])
        return false;

    /** Use wizard light sometimes **/
    if (!borg.when_wizard_light || (borg_t - borg.when_wizard_light >= 1000)) {
        if (borg_activate_item(act_clairvoyance)
            || borg_activate_item(act_enlightenment)
            || borg_spell_fail(FUME_OF_MORDOR, 40)
            || borg_spell_fail(CLAIRVOYANCE, 40)) {
            borg_note("# Wizard lighting the dungeon");
            /* borg_react("SELF:wizard lite", "SELF:wizard lite"); */
            borg.when_wizard_light = borg_t;
            return true;
        }
    }

    /* necromancers like the dark */
    if (borg.trait[BI_CLASS] == CLASS_NECROMANCER)
        return borg_check_dark_only();

    /** Work out if there's any reason to light */

    /* Don't bother because we only just did it */
    if (borg.when_call_light != 0 && (borg_t - borg.when_call_light) < 7)
        return false;

    if (borg.trait[BI_LIGHT] == 1) {
        int i;
        int corners = 0;

        /* Scan diagonal neighbors.
         *
         * 4 corners   3 corners    2 corners    1 corner    0 corners
         * ###         ##.  #..     ##.  #..     .#.         .#.  ... .#.
         * .@.         .@.  .@.     .@.  .@.     .@.         #@#  .@. .@.
         * ###         ###  ###     ##.  #..     ##.         .#.  ... .#.
         *
         * There's actually no way to tell which are rooms and which are
         * corridors from diagonals except 4 (always a corridor) and
         * 0 (always a room).  This is why we only use it for radius 1 light.
         */
        for (i = 4; i < 8; i++) {
            borg_grid *ag;

            /* Get location */
            int x = borg.c.x + ddx_ddd[i];
            int y = borg.c.y + ddy_ddd[i];

            /* Bounds check */
            if (!square_in_bounds_fully(cave, loc(x, y)))
                continue;

            /* Get grid */
            ag = &borg_grids[y][x];

            /* Location must be known */
            if (ag->feat == FEAT_NONE)
                corners++;

            /* Location must be a wall/door */
            if (!borg_cave_floor_grid(ag))
                corners++;
        }

        /* This is quite an arbitrary cutoff */
        if (corners > 2)
            return false;
    } else if (borg.trait[BI_LIGHT] > 1) {
        int x, y;
        int floors = 0;

        /*
         * Scan the surrounding 5x5 area for unlit tiles.
         *
         * Radius two light misses out the four corners but otherwise
         * illuminates a 5x5 grid, which is 21 grids illuminated incl player.
         *
         *  ...
         * .....
         * ..@..
         * .....
         *  ...
         */
        for (y = borg.c.y - 2; y <= borg.c.y + 2; y++) {
            for (x = borg.c.x - 2; x <= borg.c.x + 2; x++) {
                borg_grid *ag;

                /* Bounds check */
                if (!square_in_bounds_fully(cave, loc(x, y)))
                    continue;

                /* Get grid */
                ag = &borg_grids[y][x];

                /* Must be a floor grid lit by torchlight, not by magic */
                if (borg_cave_floor_grid(ag) && (ag->info & BORG_LIGHT)
                    && !square_isglow(cave, loc(x, y))) {
                    floors++;
                }
            }
        }

        /* Don't bother unless there are enough unlit floors */
        /* 11 is the empirical cutoff point for sensible behaviour here */
        if (floors < 11)
            return false;
    }

    /* Light it up! */
    if (borg_activate_item(act_illumination) 
        || borg_activate_item(act_light)
        || borg_zap_rod(sv_rod_illumination) 
        || borg_use_staff(sv_staff_light)
        || borg_read_scroll(sv_scroll_light) 
        || borg_spell_fail(LIGHT_ROOM, 40)
        || borg_spell_fail(CALL_LIGHT, 40)) {
        borg_note("# Illuminating the dungeon");
        borg_react("SELF:lite", "SELF:lite");
        borg.when_call_light = borg_t;
        return true;
    }

    return false;
}